

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XarHelpers.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
tools::xar::split<char>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,xar *this,char *delim,string_view s,ssize_t nsplits)

{
  size_type sVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  char *local_50;
  char *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  bVar3._M_str = delim;
  bVar3._M_len = (size_t)delim;
  pcVar2 = (char *)s._M_len;
  local_40._M_str = pcVar2;
  local_40._M_len = (size_t)delim;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (((long)s._M_str < 0 ||
         ((char *)((long)(__return_storage_ptr__->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(__return_storage_ptr__->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 5) < s._M_str))) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_40,(char)*this,0);
    if (sVar1 == 0xffffffffffffffff) {
      local_48 = local_40._M_str;
      local_50 = local_40._M_str + local_40._M_len;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*,char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_48,&local_50);
      return __return_storage_ptr__;
    }
    local_48 = local_40._M_str;
    local_50 = local_40._M_str + sVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*,char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_48,&local_50);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_40,sVar1 + 1,0xffffffffffffffff);
    pcVar2 = bVar3._M_str;
    local_40 = bVar3;
  }
  local_50 = pcVar2 + bVar3._M_len;
  local_48 = pcVar2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const*,char_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_48,&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
split(const DelimType& delim, std::string_view s, const ssize_t nsplits = -1) {
  std::vector<std::string> ret;

  while (true) {
    if (nsplits > -1 && ret.size() >= nsplits) {
      ret.emplace_back(s.begin(), s.end());
      break;
    }

    auto next = s.find(delim);
    if (next == std::string::npos) {
      ret.emplace_back(s.begin(), s.end());
      break;
    }

    ret.emplace_back(s.begin(), s.begin() + next);
    s = s.substr(next + delimSize(delim));
  }

  return ret;
}